

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rate2.cpp
# Opt level: O0

STAmount *
jbcoin::multiplyRound(STAmount *__return_storage_ptr__,STAmount *amount,Rate *rate,bool roundUp)

{
  Rate *v1;
  bool bVar1;
  Issue *issue;
  STAmount local_70;
  byte local_21;
  Rate *pRStack_20;
  bool roundUp_local;
  Rate *rate_local;
  STAmount *amount_local;
  
  local_21 = roundUp;
  pRStack_20 = rate;
  rate_local = (Rate *)amount;
  amount_local = __return_storage_ptr__;
  if (rate->value != 0) {
    bVar1 = operator==(rate,(Rate *)&parityRate);
    v1 = rate_local;
    if (bVar1) {
      STAmount::STAmount(__return_storage_ptr__,(STAmount *)rate_local);
    }
    else {
      detail::as_amount(&local_70,pRStack_20);
      issue = STAmount::issue((STAmount *)rate_local);
      mulRound(__return_storage_ptr__,(STAmount *)v1,&local_70,issue,(bool)(local_21 & 1));
      STAmount::~STAmount(&local_70);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("rate.value != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/extras/jbcoin-libpp/extras/jbcoind/src/jbcoin/protocol/impl/Rate2.cpp"
                ,0x3b,"STAmount jbcoin::multiplyRound(const STAmount &, const Rate &, bool)");
}

Assistant:

STAmount
multiplyRound (
    STAmount const& amount,
    Rate const& rate,
    bool roundUp)
{
    assert (rate.value != 0);

    if (rate == parityRate)
        return amount;

    return mulRound (
        amount,
        detail::as_amount(rate),
        amount.issue(),
        roundUp);
}